

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::object_literal_expression::print(object_literal_expression *this,wostream *os)

{
  property_assignment_type pVar1;
  size_type sVar2;
  const_reference pvVar3;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar4;
  syntax_node *psVar5;
  wostream *pwVar6;
  ulong local_20;
  size_t i;
  wostream *os_local;
  object_literal_expression *this_local;
  
  std::operator<<(os,"object_literal_expression{");
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
            ::size(&this->elements_);
    if (sVar2 <= local_20) break;
    if (local_20 != 0) {
      std::operator<<(os,", ");
    }
    pvVar3 = std::
             vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
             operator[](&this->elements_,local_20);
    pVar1 = property_name_and_value::type(pvVar3);
    if (pVar1 != normal) {
      pvVar3 = std::
               vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
               operator[](&this->elements_,local_20);
      pVar1 = property_name_and_value::type(pvVar3);
      pbVar4 = mjs::operator<<(os,pVar1);
      std::operator<<(pbVar4," ");
    }
    pvVar3 = std::
             vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
             operator[](&this->elements_,local_20);
    psVar5 = &property_name_and_value::name(pvVar3)->super_syntax_node;
    pwVar6 = mjs::operator<<(os,psVar5);
    pwVar6 = std::operator<<(pwVar6,": ");
    pvVar3 = std::
             vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
             operator[](&this->elements_,local_20);
    psVar5 = &property_name_and_value::value(pvVar3)->super_syntax_node;
    mjs::operator<<(pwVar6,psVar5);
    local_20 = local_20 + 1;
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "object_literal_expression{";
        for (size_t i = 0; i < elements_.size(); ++i) {
            if (i) os << ", ";
            if (elements_[i].type() != property_assignment_type::normal) os << elements_[i].type() << " ";
            os << elements_[i].name() << ": " << elements_[i].value();
        }
        os << "}";
    }